

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

void Excel::Parser::handleRK(Record *record,size_t sheetIdx,IStorage *storage)

{
  RecordSubstream *this;
  long lVar1;
  long lVar2;
  int16_t row;
  int16_t column;
  size_t local_40;
  uint32_t rk;
  
  row = 0;
  column = 0;
  rk = 0;
  this = &record->m_stream;
  local_40 = sheetIdx;
  Stream::read<short>(&this->super_Stream,&row,2);
  Stream::read<short>(&this->super_Stream,&column,2);
  (*(record->m_stream).super_Stream._vptr_Stream[4])(this,2,1);
  Stream::read<unsigned_int>(&this->super_Stream,&rk,4);
  lVar1 = (long)row;
  lVar2 = (long)column;
  doubleFromRK(rk);
  (*storage->_vptr_IStorage[7])(storage,local_40,lVar1,lVar2);
  return;
}

Assistant:

inline void
Parser::handleRK( Record & record, size_t sheetIdx, IStorage & storage )
{
	int16_t row = 0;
	int16_t column = 0;
	uint32_t rk = 0;

	record.dataStream().read( row, 2 );
	record.dataStream().read( column, 2 );

	record.dataStream().seek( 2, Stream::FromCurrent );
	record.dataStream().read( rk, 4 );

	storage.onCell( sheetIdx, row, column, doubleFromRK( rk ) );
}